

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RunSingleCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *command,string *captureStdOut,string *captureStdErr,int *retVal,char *dir,
               OutputOption outputflag,double timeout)

{
  string *psVar1;
  char cVar2;
  int i;
  int iVar3;
  cmsysProcess *cp;
  long lVar4;
  char *pcVar5;
  ostream *poVar6;
  pointer pbVar7;
  bool bVar8;
  int length;
  string *local_a0;
  char *data;
  char *local_90;
  vector<char,_std::allocator<char>_> tempStdOut;
  vector<char,_std::allocator<char>_> tempStdErr;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = captureStdErr;
  local_90 = dir;
  for (pbVar7 = (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar7 != (command->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
    tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pbVar7->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&tempStdOut);
  }
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&tempStdOut);
  psVar1 = local_a0;
  if (captureStdOut != (string *)0x0) {
    std::__cxx11::string::assign((char *)captureStdOut);
  }
  if (psVar1 != captureStdOut && psVar1 != (string *)0x0) {
    std::__cxx11::string::assign((char *)psVar1);
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,local_90);
  if (s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  if (outputflag == OUTPUT_PASSTHROUGH) {
    cmsysProcess_SetPipeShared(cp,2,1);
    cmsysProcess_SetPipeShared(cp,3,1);
  }
  cmsysProcess_SetTimeout(cp,timeout);
  cmsysProcess_Execute(cp);
  local_90 = (char *)CONCAT71(local_90._1_7_,psVar1 == captureStdOut || psVar1 == (string *)0x0);
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if ((outputflag != OUTPUT_PASSTHROUGH) &&
     ((captureStdOut != (string *)0x0 || local_a0 != (string *)0x0) || outputflag != OUTPUT_NONE)) {
LAB_0027030d:
    do {
      iVar3 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0);
      if (iVar3 < 1) break;
      for (lVar4 = 0; lVar4 < length; lVar4 = lVar4 + 1) {
        if (data[lVar4] == '\0') {
          data[lVar4] = ' ';
        }
      }
      if ((iVar3 == 2) || (iVar3 == 3 && local_a0 == captureStdOut)) {
        if (captureStdOut != (string *)0x0) {
          std::vector<char,std::allocator<char>>::insert<char*,void>
                    ((vector<char,std::allocator<char>> *)&tempStdOut,
                     (const_iterator)
                     tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,data,data + length);
        }
      }
      else if (local_a0 != (string *)0x0 && iVar3 == 3) {
        std::vector<char,std::allocator<char>>::insert<char*,void>
                  ((vector<char,std::allocator<char>> *)&tempStdErr,
                   (const_iterator)
                   tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,data,data + length);
      }
      if (outputflag != OUTPUT_NONE) {
        if (outputflag != OUTPUT_MERGE) {
          if (iVar3 == 3) {
            Stderr(data,(long)length);
            goto LAB_0027030d;
          }
          if (iVar3 != 2) goto LAB_0027030d;
        }
        Stdout(data,(long)length);
      }
    } while( true );
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  cVar2 = (char)local_90;
  if ((captureStdOut != (string *)0x0) &&
     (tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)captureStdOut,
               (ulong)tempStdOut.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  psVar1 = local_a0;
  if ((cVar2 == '\0') &&
     (tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)local_a0,
               (ulong)tempStdErr.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  iVar3 = cmsysProcess_GetState(cp);
  if (iVar3 == 4) {
    if (retVal == (int *)0x0) {
      iVar3 = cmsysProcess_GetExitValue(cp);
      bVar8 = iVar3 == 0;
    }
    else {
      iVar3 = cmsysProcess_GetExitValue(cp);
      *retVal = iVar3;
      bVar8 = true;
    }
  }
  else {
    iVar3 = cmsysProcess_GetState(cp);
    if (iVar3 == 2) {
      pcVar5 = cmsysProcess_GetExceptionString(cp);
      if (outputflag != OUTPUT_NONE) {
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      if (psVar1 != (string *)0x0) {
        strlen(pcVar5);
        std::__cxx11::string::append((char *)psVar1,(ulong)pcVar5);
      }
    }
    else {
      iVar3 = cmsysProcess_GetState(cp);
      if (iVar3 == 1) {
        pcVar5 = cmsysProcess_GetErrorString(cp);
        if (outputflag != OUTPUT_NONE) {
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar5);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        if (psVar1 != (string *)0x0) {
          strlen(pcVar5);
          std::__cxx11::string::append((char *)psVar1,(ulong)pcVar5);
        }
      }
      else {
        iVar3 = cmsysProcess_GetState(cp);
        bVar8 = true;
        if (iVar3 != 5) goto LAB_0027057d;
        if (outputflag != OUTPUT_NONE) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Process terminated due to timeout\n");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        if (psVar1 != (string *)0x0) {
          std::__cxx11::string::append((char *)psVar1,0x4674f1);
        }
      }
    }
    bVar8 = false;
  }
LAB_0027057d:
  cmsysProcess_Delete(cp);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdErr.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempStdOut.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return bVar8;
}

Assistant:

bool cmSystemTools::RunSingleCommand(std::vector<std::string>const& command,
                                     std::string* captureStdOut,
                                     std::string* captureStdErr,
                                     int* retVal , const char* dir ,
                                     OutputOption outputflag ,
                                     double timeout )
{
  std::vector<const char*> argv;
  for(std::vector<std::string>::const_iterator a = command.begin();
      a != command.end(); ++a)
    {
    argv.push_back(a->c_str());
    }
  argv.push_back(0);
  if ( captureStdOut )
    {
    *captureStdOut = "";
    }
  if (captureStdErr && captureStdErr != captureStdOut)
    {
    *captureStdErr = "";
    }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  if (outputflag == OUTPUT_PASSTHROUGH)
    {
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDOUT, 1);
    cmsysProcess_SetPipeShared(cp, cmsysProcess_Pipe_STDERR, 1);
    }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> tempStdOut;
  std::vector<char> tempStdErr;
  char* data;
  int length;
  int pipe;
  if(outputflag != OUTPUT_PASSTHROUGH &&
     (captureStdOut || captureStdErr || outputflag != OUTPUT_NONE))
    {
    while((pipe = cmsysProcess_WaitForData(cp, &data, &length, 0)) > 0)
      {
      if(captureStdOut || captureStdErr || outputflag != OUTPUT_NONE)
        {
        // Translate NULL characters in the output into valid text.
        // Visual Studio 7 puts these characters in the output of its
        // build process.
        for(int i=0; i < length; ++i)
          {
          if(data[i] == '\0')
            {
            data[i] = ' ';
            }
          }
        }
      if(pipe == cmsysProcess_Pipe_STDOUT ||
         (pipe == cmsysProcess_Pipe_STDERR &&
          captureStdOut == captureStdErr))
        {
        if (captureStdOut)
          {
          tempStdOut.insert(tempStdOut.end(), data, data+length);
          }
        }
      else if(pipe == cmsysProcess_Pipe_STDERR)
        {
        if (captureStdErr)
          {
          tempStdErr.insert(tempStdErr.end(), data, data+length);
          }
        }
      if(outputflag != OUTPUT_NONE)
        {
        if(outputflag == OUTPUT_MERGE)
          {
          cmSystemTools::Stdout(data, length);
          }
        else
          {
          if(pipe == cmsysProcess_Pipe_STDERR)
            {
            cmSystemTools::Stderr(data, length);
            }
          else if(pipe == cmsysProcess_Pipe_STDOUT)
            {
            cmSystemTools::Stdout(data, length);
            }
          }
        }
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if ( captureStdOut && tempStdOut.begin() != tempStdOut.end())
    {
    captureStdOut->append(&*tempStdOut.begin(), tempStdOut.size());
    }
  if ( captureStdErr && captureStdErr != captureStdOut &&
       tempStdErr.begin() != tempStdErr.end())
    {
    captureStdErr->append(&*tempStdErr.begin(), tempStdErr.size());
    }

  bool result = true;
  if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exited)
    {
    if ( retVal )
      {
      *retVal = cmsysProcess_GetExitValue(cp);
      }
    else
      {
      if ( cmsysProcess_GetExitValue(cp) !=  0 )
        {
        result = false;
        }
      }
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Exception)
    {
    const char* exception_str = cmsysProcess_GetExceptionString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << exception_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(exception_str, strlen(exception_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Error)
    {
    const char* error_str = cmsysProcess_GetErrorString(cp);
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }
  else if(cmsysProcess_GetState(cp) == cmsysProcess_State_Expired)
    {
    const char* error_str = "Process terminated due to timeout\n";
    if ( outputflag != OUTPUT_NONE )
      {
      std::cerr << error_str << std::endl;
      }
    if ( captureStdErr )
      {
      captureStdErr->append(error_str, strlen(error_str));
      }
    result = false;
    }

  cmsysProcess_Delete(cp);
  return result;
}